

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void init_attr(int np)

{
  schar *psVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  xchar xVar5;
  int iVar6;
  uint uVar8;
  int iVar9;
  ulong uVar7;
  
  for (lVar4 = -6; lVar4 != 0; lVar4 = lVar4 + 1) {
    cVar2 = urole.attrdist[lVar4];
    u.atemp.a[lVar4] = cVar2;
    u.aexe.a[lVar4] = cVar2;
    *(undefined1 *)((long)(&u.atime + 1) + lVar4) = 0;
    u.atime.a[lVar4] = '\0';
    np = np - cVar2;
  }
  uVar8 = np >> 0x1f & np;
LAB_0014ed80:
  uVar3 = uVar8;
  if (0 < np) {
    iVar9 = 0;
LAB_0014ed8a:
    uVar3 = np;
    if (iVar9 != 100) {
      do {
        uVar3 = mt_random();
        uVar7 = (ulong)uVar3 % 100;
        for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
          iVar6 = (int)uVar7;
          uVar3 = iVar6 - urole.attrdist[lVar4];
          uVar7 = (ulong)uVar3;
          if (uVar3 == 0 || iVar6 < urole.attrdist[lVar4]) {
            cVar2 = u.acurr.a[lVar4];
            if (((lVar4 != 0) || (u.umonnum == u.umonster)) ||
               (xVar5 = 'v', ((youmonst.data)->mflags2 & 0x4000000) == 0)) {
              xVar5 = urace.attrmax[lVar4];
            }
            iVar9 = iVar9 + 1;
            if (xVar5 <= cVar2) goto LAB_0014ed8a;
            u.acurr.a[lVar4] = cVar2 + '\x01';
            psVar1 = u.amax.a + lVar4;
            *psVar1 = *psVar1 + '\x01';
            np = np - 1;
            goto LAB_0014ed80;
          }
        }
      } while( true );
    }
  }
LAB_0014ee10:
  if ((int)uVar3 < 0) {
    iVar9 = 0;
LAB_0014ee16:
    if (iVar9 != 100) {
      do {
        uVar8 = mt_random();
        uVar7 = (ulong)uVar8 % 100;
        for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
          iVar6 = (int)uVar7;
          uVar8 = iVar6 - urole.attrdist[lVar4];
          uVar7 = (ulong)uVar8;
          if (uVar8 == 0 || iVar6 < urole.attrdist[lVar4]) {
            cVar2 = u.acurr.a[lVar4];
            iVar9 = iVar9 + 1;
            if (cVar2 <= urace.attrmin[lVar4]) goto LAB_0014ee16;
            u.acurr.a[lVar4] = cVar2 + -1;
            psVar1 = u.amax.a + lVar4;
            *psVar1 = *psVar1 + -1;
            uVar3 = uVar3 + 1;
            goto LAB_0014ee10;
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void init_attr(int np)
{
	int	i, x, tryct;


	for (i = 0; i < A_MAX; i++) {
	    ABASE(i) = AMAX(i) = urole.attrbase[i];
	    ATEMP(i) = ATIME(i) = 0;
	    np -= urole.attrbase[i];
	}

	tryct = 0;
	while (np > 0 && tryct < 100) {

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) >= ATTRMAX(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)++;
	    AMAX(i)++;
	    np--;
	}

	tryct = 0;
	while (np < 0 && tryct < 100) {		/* for redistribution */

	    x = rn2(100);
	    for (i = 0; (i < A_MAX) && ((x -= urole.attrdist[i]) > 0); i++) ;
	    if (i >= A_MAX) continue; /* impossible */

	    if (ABASE(i) <= ATTRMIN(i)) {

		tryct++;
		continue;
	    }
	    tryct = 0;
	    ABASE(i)--;
	    AMAX(i)--;
	    np++;
	}
}